

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NtkPrintDistribInternal
               (FILE *pFile,Abc_Ntk_t *pNtk,char *pFanins,char *pFanouts,char *pNode,char *pFanin,
               char *pFanout,Vec_Int_t *vFan,Vec_Int_t *vFon,Vec_Int_t *vFanR,Vec_Int_t *vFonR)

{
  uint uVar1;
  uint uVar2;
  int i;
  int iVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar7 = vFan->nSize;
  uVar8 = vFon->nSize;
  fprintf((FILE *)pFile,"The distribution of %s and %s in the network:\n");
  fprintf((FILE *)pFile,"  Number   %s with %s  %s with %s          Repr1             Repr2\n",pNode
          ,pFanin,pNode,pFanout);
  if ((int)uVar7 < (int)uVar8) {
    uVar7 = uVar8;
  }
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    uVar6 = 0;
    uVar1 = 0;
    if ((int)uVar8 < vFan->nSize) {
      uVar1 = Vec_IntEntry(vFan,uVar8);
    }
    if ((int)uVar8 < vFon->nSize) {
      uVar2 = Vec_IntEntry(vFon,uVar8);
      uVar6 = (ulong)uVar2;
    }
    iVar3 = (int)uVar6;
    if (uVar1 != 0 || iVar3 != 0) {
      fprintf((FILE *)pFile,"%5d : ",(ulong)uVar8);
      if (uVar1 == 0) {
        fwrite("              ",0xe,1,(FILE *)pFile);
      }
      else {
        fprintf((FILE *)pFile,"%12d  ",(ulong)uVar1);
      }
      fwrite("    ",4,1,(FILE *)pFile);
      if (iVar3 == 0) {
        fwrite("              ",0xe,1,(FILE *)pFile);
      }
      else {
        fprintf((FILE *)pFile,"%12d  ",uVar6);
      }
      fwrite("        ",8,1,(FILE *)pFile);
      if (uVar1 == 0) {
        fwrite("              ",0xe,1,(FILE *)pFile);
      }
      else {
        i = Vec_IntEntry(vFanR,uVar8);
        pAVar4 = Abc_NtkObj(pNtk,i);
        pcVar5 = Abc_ObjName(pAVar4);
        fprintf((FILE *)pFile,"%12s  ",pcVar5);
      }
      fwrite("    ",4,1,(FILE *)pFile);
      if (iVar3 == 0) {
        fwrite("              ",0xe,1,(FILE *)pFile);
      }
      else {
        iVar3 = Vec_IntEntry(vFonR,uVar8);
        pAVar4 = Abc_NtkObj(pNtk,iVar3);
        pcVar5 = Abc_ObjName(pAVar4);
        fprintf((FILE *)pFile,"%12s  ",pcVar5);
      }
      fputc(10,(FILE *)pFile);
    }
  }
  return;
}

Assistant:

void Abc_NtkPrintDistribInternal( FILE * pFile, Abc_Ntk_t * pNtk, char * pFanins, char * pFanouts, char * pNode, char * pFanin, char * pFanout, 
                                 Vec_Int_t * vFan, Vec_Int_t * vFon, Vec_Int_t * vFanR, Vec_Int_t * vFonR )
{
    int k, nSizeMax = Abc_MaxInt( Vec_IntSize(vFan), Vec_IntSize(vFon) );
    fprintf( pFile, "The distribution of %s and %s in the network:\n", pFanins, pFanouts );
    fprintf( pFile, "  Number   %s with %s  %s with %s          Repr1             Repr2\n", pNode, pFanin, pNode, pFanout );
    for ( k = 0; k < nSizeMax; k++ )
    {
        int EntryFan = k < Vec_IntSize(vFan) ? Vec_IntEntry(vFan, k) : 0;
        int EntryFon = k < Vec_IntSize(vFon) ? Vec_IntEntry(vFon, k) : 0;
        if ( EntryFan == 0 && EntryFon == 0 )
            continue;

        fprintf( pFile, "%5d : ", k );
        if ( EntryFan == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12d  ", EntryFan );
        fprintf( pFile, "    " );
        if ( EntryFon == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12d  ", EntryFon );

        fprintf( pFile, "        " );
        if ( EntryFan == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12s  ", Abc_ObjName(Abc_NtkObj(pNtk, Vec_IntEntry(vFanR, k))) );
        fprintf( pFile, "    " );
        if ( EntryFon == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12s  ", Abc_ObjName(Abc_NtkObj(pNtk, Vec_IntEntry(vFonR, k))) );
        fprintf( pFile, "\n" );
    }
}